

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_function::dump(statement_function *this,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RSI;
  _Self *in_RDI;
  statement_base **ptr;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1_1;
  any *name;
  const_iterator_conflict __end1;
  const_iterator_conflict __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  *in_stack_ffffffffffffff80;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_58;
  _Elt_pointer *local_38;
  string *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  pointer *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,"< BeginFunction: ID = \"");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 1));
  std::operator<<(poVar2,"\"");
  if (((ulong)in_RDI[6]._M_first & 1) == 0) {
    std::operator<<(local_10,", Override = False >\n");
  }
  else {
    std::operator<<(local_10,", Override = True >\n");
  }
  std::operator<<(local_10,"< FunctionArgs = {");
  local_18 = (pointer *)&in_RDI[6]._M_last;
  local_20._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    local_30 = (string *)
               __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_20);
    poVar2 = std::operator<<(local_10,"< ID = \"");
    poVar2 = std::operator<<(poVar2,local_30);
    std::operator<<(poVar2,"\" >");
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_20);
  }
  std::operator<<(local_10,"} >\n< Body >\n");
  local_38 = &in_RDI[7]._M_first;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff80,in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 =
         (_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
          *)std::
            _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
            ::operator*(&local_58);
    (*((statement_base *)in_stack_ffffffffffffff80->_M_cur)->_vptr_statement_base[5])
              ((statement_base *)in_stack_ffffffffffffff80->_M_cur,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_stack_ffffffffffffff80);
  }
  std::operator<<(local_10,"< EndFunction >\n");
  return;
}

Assistant:

void statement_function::dump(std::ostream &o) const
	{
		o << "< BeginFunction: ID = \"" << mName << "\"";
		if (mOverride)
			o << ", Override = True >\n";
		else
			o << ", Override = False >\n";
		o << "< FunctionArgs = {";
		for (auto &name: mArgs)
			o << "< ID = \"" << name << "\" >";
		o << "} >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndFunction >\n";
	}